

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_doc.c
# Opt level: O1

HPDF_Page HPDF_AddPage(HPDF_Doc pdf)

{
  HPDF_BOOL HVar1;
  HPDF_Pages p_Var2;
  HPDF_Page kid;
  HPDF_STATUS error_no;
  
  HVar1 = HPDF_HasDoc(pdf);
  if (HVar1 != 0) {
    if ((pdf->page_per_pages != 0) && (pdf->page_per_pages <= pdf->cur_page_num)) {
      p_Var2 = HPDF_Doc_AddPagesTo(pdf,pdf->root_pages);
      pdf->cur_pages = p_Var2;
      if (p_Var2 == (HPDF_Pages)0x0) {
        return (HPDF_Page)0x0;
      }
      pdf->cur_page_num = 0;
    }
    kid = HPDF_Page_New(pdf->mmgr,pdf->xref);
    if (kid != (HPDF_Page)0x0) {
      error_no = HPDF_Pages_AddKids(pdf->cur_pages,kid);
      if ((error_no == 0) && (error_no = HPDF_List_Add(pdf->page_list,kid), error_no == 0)) {
        pdf->cur_page = kid;
        if ((pdf->compression_mode & 1) != 0) {
          HPDF_Page_SetFilter(kid,0x400);
        }
        pdf->cur_page_num = pdf->cur_page_num + 1;
        return kid;
      }
      HPDF_RaiseError(&pdf->error,error_no,0);
      return (HPDF_Page)0x0;
    }
    HPDF_CheckError(&pdf->error);
  }
  return (HPDF_Page)0x0;
}

Assistant:

HPDF_EXPORT(HPDF_Page)
HPDF_AddPage  (HPDF_Doc  pdf)
{
    HPDF_Page page;
    HPDF_STATUS ret;

    HPDF_PTRACE ((" HPDF_AddPage\n"));

    if (!HPDF_HasDoc (pdf))
        return NULL;

    if (pdf->page_per_pages) {
        if (pdf->page_per_pages <= pdf->cur_page_num) {
            pdf->cur_pages = HPDF_Doc_AddPagesTo (pdf, pdf->root_pages);
            if (!pdf->cur_pages)
                return NULL;
            pdf->cur_page_num = 0;
        }
    }

    page = HPDF_Page_New (pdf->mmgr, pdf->xref);
    if (!page) {
        HPDF_CheckError (&pdf->error);
        return NULL;
    }

    if ((ret = HPDF_Pages_AddKids (pdf->cur_pages, page)) != HPDF_OK) {
        HPDF_RaiseError (&pdf->error, ret, 0);
        return NULL;
    }

    if ((ret = HPDF_List_Add (pdf->page_list, page)) != HPDF_OK) {
        HPDF_RaiseError (&pdf->error, ret, 0);
        return NULL;
    }

    pdf->cur_page = page;

    if (pdf->compression_mode & HPDF_COMP_TEXT)
        HPDF_Page_SetFilter (page, HPDF_STREAM_FILTER_FLATE_DECODE);

    pdf->cur_page_num++;

    return page;
}